

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDAWBICMetropolisSampler.cpp
# Opt level: O0

double calculateLogProposalDistributionValue
                 (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *thetaDestination,
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *phiDestination,
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *alphaSource,
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *betaSource)

{
  ulong uVar1;
  size_type sVar2;
  const_reference pvVar3;
  double dVar4;
  vector<double,_std::allocator<double>_> local_a8;
  vector<double,_std::allocator<double>_> local_90;
  int local_78;
  int k;
  vector<double,_std::allocator<double>_> local_68;
  vector<double,_std::allocator<double>_> local_50;
  int local_34;
  double dStack_30;
  int d;
  double logPriorDistributionValue;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *betaSource_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *alphaSource_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *phiDestination_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *thetaDestination_local;
  
  dStack_30 = 0.0;
  local_34 = 0;
  logPriorDistributionValue = (double)betaSource;
  betaSource_local = alphaSource;
  alphaSource_local = phiDestination;
  phiDestination_local = thetaDestination;
  while( true ) {
    uVar1 = (ulong)local_34;
    sVar2 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(phiDestination_local);
    if (sVar2 <= uVar1) break;
    pvVar3 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](phiDestination_local,(long)local_34);
    std::vector<double,_std::allocator<double>_>::vector(&local_50,pvVar3);
    pvVar3 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](alphaSource,(long)local_34);
    std::vector<double,_std::allocator<double>_>::vector(&local_68,pvVar3);
    dVar4 = calculateDirichletLogPdf(&local_50,&local_68);
    dStack_30 = dVar4 + dStack_30;
    std::vector<double,_std::allocator<double>_>::~vector(&local_68);
    std::vector<double,_std::allocator<double>_>::~vector(&local_50);
    local_34 = local_34 + 1;
  }
  local_78 = 0;
  while( true ) {
    uVar1 = (ulong)local_78;
    sVar2 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(alphaSource_local);
    if (sVar2 <= uVar1) break;
    pvVar3 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](alphaSource_local,(long)local_78);
    std::vector<double,_std::allocator<double>_>::vector(&local_90,pvVar3);
    pvVar3 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](betaSource,(long)local_78);
    std::vector<double,_std::allocator<double>_>::vector(&local_a8,pvVar3);
    dVar4 = calculateDirichletLogPdf(&local_90,&local_a8);
    dStack_30 = dVar4 + dStack_30;
    std::vector<double,_std::allocator<double>_>::~vector(&local_a8);
    std::vector<double,_std::allocator<double>_>::~vector(&local_90);
    local_78 = local_78 + 1;
  }
  return dStack_30;
}

Assistant:

double calculateLogProposalDistributionValue(const vector<vector<double> > &thetaDestination, const vector<vector<double> > &phiDestination, const vector<vector<double>> alphaSource, const vector<vector<double>> betaSource){
    double logPriorDistributionValue = 0.0;
    for(int d=0; d<thetaDestination.size(); d++){
        logPriorDistributionValue += calculateDirichletLogPdf(thetaDestination[d], alphaSource[d]);
    }
    for(int k=0; k<phiDestination.size(); k++){
        logPriorDistributionValue += calculateDirichletLogPdf(phiDestination[k], betaSource[k]);
    }
    return logPriorDistributionValue;
}